

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlSchematronPtr xmlSchematronNewSchematron(xmlSchematronParserCtxtPtr ctxt)

{
  xmlSchematronPtr ret;
  xmlSchematronParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlSchematronParserCtxtPtr)(*xmlMalloc)(0x60);
  if (ctxt_local == (xmlSchematronParserCtxtPtr)0x0) {
    xmlSchematronPErrMemory(ctxt,"allocating schema",(xmlNodePtr)0x0);
    ctxt_local = (xmlSchematronParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0x60);
    *(xmlDictPtr *)&ctxt_local->size = ctxt->dict;
    xmlDictReference(*(xmlDictPtr *)&ctxt_local->size);
  }
  return (xmlSchematronPtr)ctxt_local;
}

Assistant:

static xmlSchematronPtr
xmlSchematronNewSchematron(xmlSchematronParserCtxtPtr ctxt)
{
    xmlSchematronPtr ret;

    ret = (xmlSchematronPtr) xmlMalloc(sizeof(xmlSchematron));
    if (ret == NULL) {
        xmlSchematronPErrMemory(ctxt, "allocating schema", NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematron));
    ret->dict = ctxt->dict;
    xmlDictReference(ret->dict);

    return (ret);
}